

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableArrayWalker::Get(RecyclableArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  RecyclableArrayAddress *this_00;
  uint32 local_7c;
  TrackAllocData local_60;
  uint local_38;
  uint32 local_34;
  uint32 absIndex;
  int nonArrayElementCount;
  JavascriptArray *arrayObj;
  ResolvedObject *pResolvedObject_local;
  RecyclableArrayWalker *pRStack_18;
  int i_local;
  RecyclableArrayWalker *this_local;
  
  arrayObj = (JavascriptArray *)pResolvedObject;
  pResolvedObject_local._4_4_ = i;
  pRStack_18 = this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb8f,"(pResolvedObject)","Bad usage of RecyclableArrayWalker::Get"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if ((!bVar2) &&
     (bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance), !bVar2)) {
    return 0;
  }
  _absIndex = GetArrayObject(this);
  if ((this->fOnlyOwnProperties & 1U) == 0) {
    local_7c = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker);
  }
  else {
    local_7c = 0;
  }
  local_34 = local_7c;
  if (pResolvedObject_local._4_4_ < (int)local_7c) {
    this_local._4_4_ =
         RecyclableObjectWalker::Get
                   (&this->super_RecyclableObjectWalker,pResolvedObject_local._4_4_,
                    (ResolvedObject *)arrayObj);
  }
  else {
    pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - local_7c;
    GetResolvedObject(this,_absIndex,pResolvedObject_local._4_4_,(ResolvedObject *)arrayObj,
                      &local_38);
    pAVar4 = &GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&RecyclableArrayAddress::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xba4);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_60);
    this_00 = (RecyclableArrayAddress *)
              new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar4,0x3f67b0);
    RecyclableArrayAddress::RecyclableArrayAddress
              (this_00,(this->super_RecyclableObjectWalker).instance,local_38);
    (arrayObj->super_ArrayObject).super_DynamicObject.auxSlots.ptr =
         (WriteBarrierPtr<void> *)this_00;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL RecyclableArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableArrayWalker::Get");

        if (Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))
        {
            Js::JavascriptArray* arrayObj = GetArrayObject();

            int nonArrayElementCount = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

            if (i < nonArrayElementCount)
            {
                return RecyclableObjectWalker::Get(i, pResolvedObject);
            }
            else
            {
                i -= nonArrayElementCount;
                uint32 absIndex; // Absolute index
                GetResolvedObject(arrayObj, i, pResolvedObject, &absIndex);

                pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                    RecyclableArrayAddress,
                    instance,
                    absIndex);

                return TRUE;
            }
        }
        return FALSE;
    }